

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk-c.cpp
# Opt level: O1

duckdb_vector duckdb_create_vector(duckdb_logical_type type,idx_t capacity)

{
  Vector *this;
  LogicalType local_30;
  
  this = (Vector *)operator_new(0x68);
  duckdb::LogicalType::LogicalType(&local_30,(LogicalType *)type);
  duckdb::Vector::Vector(this,&local_30,capacity);
  duckdb::LogicalType::~LogicalType(&local_30);
  return (duckdb_vector)this;
}

Assistant:

duckdb_vector duckdb_create_vector(duckdb_logical_type type, idx_t capacity) {
	auto dtype = reinterpret_cast<duckdb::LogicalType *>(type);
	auto vector = new duckdb::Vector(*dtype, capacity);
	return reinterpret_cast<duckdb_vector>(vector);
}